

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O1

void __thiscall
glslang::TParseVersions::requireInt16Arithmetic
          (TParseVersions *this,TSourceLoc *loc,char *op,char *featureDesc)

{
  size_t __len2;
  TString combined;
  char *extensions [3];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_70;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  char *local_38;
  
  local_70._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  __len2 = strlen(op);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_replace(&local_70,0,0,op,__len2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&local_70,": ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&local_70,featureDesc);
  local_38 = "GL_EXT_shader_explicit_arithmetic_types_int16";
  local_48 = 0x8544db;
  uStack_44 = 0;
  uStack_40 = 0x854dc5;
  uStack_3c = 0;
  (*this->_vptr_TParseVersions[5])(this,loc,3,&local_48,local_70._M_dataplus._M_p);
  return;
}

Assistant:

void TParseVersions::requireInt16Arithmetic(const TSourceLoc& loc, const char* op, const char* featureDesc)
{
    TString combined;
    combined = op;
    combined += ": ";
    combined += featureDesc;

    const char* const extensions[] = {
                                       E_GL_AMD_gpu_shader_int16,
                                       E_GL_EXT_shader_explicit_arithmetic_types,
                                       E_GL_EXT_shader_explicit_arithmetic_types_int16};
    requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, combined.c_str());
}